

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_internal.h
# Opt level: O2

TrackSet<ASDCP::MXF::TimecodeComponent> *
ASDCP::MXF::CreateTimecodeTrack<ASDCP::MXF::MaterialPackage>
          (TrackSet<ASDCP::MXF::TimecodeComponent> *__return_storage_ptr__,OP1aHeader *Header,
          MaterialPackage *Package,Rational *tc_edit_rate,ui32_t tc_frame_rate,ui64_t TCStart,
          Dictionary *Dict)

{
  MDDEntry *pMVar1;
  TimecodeComponent *pTVar2;
  Dictionary *in_stack_ffffffffffffff78;
  allocator<char> local_79;
  ui64_t local_78;
  undefined1 local_70 [8];
  undefined1 local_68;
  undefined8 local_67;
  undefined8 uStack_5f;
  
  local_78 = TCStart;
  if (Dict != (Dictionary *)0x0) {
    pMVar1 = Dictionary::Type(Dict,MDD_TimecodeDataDef);
    local_68 = 1;
    local_67 = *(undefined8 *)pMVar1->ul;
    uStack_5f = *(undefined8 *)(pMVar1->ul + 8);
    local_70 = (undefined1  [8])&PTR__IArchive_002112c8;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xffffffffffffffb0,"Timecode Track",&local_79);
    CreateTrackAndSequence<ASDCP::MXF::MaterialPackage,ASDCP::MXF::TimecodeComponent>
              (__return_storage_ptr__,(MXF *)Header,(OP1aHeader *)Package,
               (MaterialPackage *)&stack0xffffffffffffffb0,(string *)tc_edit_rate,
               (Rational *)local_70,(UL *)0x1,(ui32_t)Dict,in_stack_ffffffffffffff78);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    pTVar2 = (TimecodeComponent *)operator_new(0xe8);
    TimecodeComponent::TimecodeComponent(pTVar2,Dict);
    __return_storage_ptr__->Clip = pTVar2;
    (*(Header->super_Partition).super_KLVFilePacket.super_KLVPacket._vptr_KLVPacket[0xd])
              (Header,pTVar2);
    std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::push_back
              (&(__return_storage_ptr__->Sequence->StructuralComponents).
                super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>
                .super_vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>,
               &(__return_storage_ptr__->Clip->super_StructuralComponent).super_InterchangeObject.
                InstanceUID);
    pTVar2 = __return_storage_ptr__->Clip;
    pTVar2->RoundedTimecodeBase = (ui16_t)tc_frame_rate;
    pTVar2->StartTimecode = local_78;
    (pTVar2->super_StructuralComponent).DataDefinition.super_Identifier<16U>.m_HasValue =
         (bool)local_68;
    *(undefined8 *)(pTVar2->super_StructuralComponent).DataDefinition.super_Identifier<16U>.m_Value
         = local_67;
    *(undefined8 *)
     ((pTVar2->super_StructuralComponent).DataDefinition.super_Identifier<16U>.m_Value + 8) =
         uStack_5f;
    return __return_storage_ptr__;
  }
  __assert_fail("Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_internal.h"
                ,0x21c,
                "TrackSet<TimecodeComponent> ASDCP::MXF::CreateTimecodeTrack(OP1aHeader &, PackageT &, const MXF::Rational &, ui32_t, ui64_t, const Dictionary *) [PackageT = ASDCP::MXF::MaterialPackage]"
               );
}

Assistant:

TrackSet<TimecodeComponent>
	CreateTimecodeTrack(OP1aHeader& Header, PackageT& Package,
			    const MXF::Rational& tc_edit_rate, ui32_t tc_frame_rate, ui64_t TCStart, const Dictionary *Dict)
	{
	  assert(Dict);
	  UL TCUL(Dict->ul(MDD_TimecodeDataDef));

	  TrackSet<TimecodeComponent> NewTrack =
	    CreateTrackAndSequence<PackageT, TimecodeComponent>(Header, Package, "Timecode Track",
								tc_edit_rate, TCUL, 1, Dict);

	  NewTrack.Clip = new TimecodeComponent(Dict);
	  Header.AddChildObject(NewTrack.Clip);
	  NewTrack.Sequence->StructuralComponents.push_back(NewTrack.Clip->InstanceUID);
	  NewTrack.Clip->RoundedTimecodeBase = tc_frame_rate;
	  NewTrack.Clip->StartTimecode = TCStart;
	  NewTrack.Clip->DataDefinition = TCUL;

	  return NewTrack;
	}